

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O0

void __thiscall
CAMFImporter_NodeElement_Texture::CAMFImporter_NodeElement_Texture
          (CAMFImporter_NodeElement_Texture *this,CAMFImporter_NodeElement *pParent)

{
  CAMFImporter_NodeElement *pParent_local;
  CAMFImporter_NodeElement_Texture *this_local;
  
  CAMFImporter_NodeElement::CAMFImporter_NodeElement
            (&this->super_CAMFImporter_NodeElement,ENET_Texture,pParent);
  (this->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Texture_00f3fc08;
  this->Width = 0;
  this->Height = 0;
  this->Depth = 0;
  memset(&this->Data,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->Data);
  this->Tiled = false;
  return;
}

Assistant:

CAMFImporter_NodeElement_Texture(CAMFImporter_NodeElement* pParent)
	: CAMFImporter_NodeElement(ENET_Texture, pParent)
    , Width( 0 )
    , Height( 0 )
    , Depth( 0 )
    , Data()
    , Tiled( false ){
        // empty
    }